

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O2

void __thiscall
InterpTest_HostFunc_PingPong_SameThread_Test::TestBody
          (InterpTest_HostFunc_PingPong_SameThread_Test *this)

{
  Store *store;
  Func *this_00;
  char *pcVar1;
  AssertionResult gtest_ar;
  AssertHelper local_1e8;
  undefined8 local_1e0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  Values results;
  Ptr trap;
  Result result;
  Ptr host_func;
  _Vector_base<wabt::Type,_std::allocator<wabt::Type>_> local_158;
  _Vector_base<wabt::Type,_std::allocator<wabt::Type>_> local_138;
  _Any_data local_118;
  code *local_108;
  code *local_100;
  Thread thread;
  FuncType local_68;
  
  thread.values_.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x9010b0a010067;
  thread.values_.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0xb00106a01410020;
  thread.frames_.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x660100010602;
  thread.values_.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x101050700010203;
  thread.frames_.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x16d736100;
  thread.frames_.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x7f017f0160010601;
  host_func.obj_ = (HostFunc *)0x0;
  host_func.store_ = (Store *)0x0;
  host_func.root_index_ = 0;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_range_initialize<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&host_func,&thread);
  InterpTest::ReadModule
            (&this->super_InterpTest,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&host_func);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&host_func);
  store = &(this->super_InterpTest).store_;
  wabt::interp::Thread::Thread(&thread,store,(Stream *)0x0);
  results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xffffffff;
  local_138._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_range_initialize<wabt::Type_const*>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)&local_138,&results);
  trap.obj_ = (Trap *)0xffffffff;
  local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_range_initialize<wabt::Type_const*>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)&local_158,&trap);
  wabt::interp::FuncType::FuncType(&local_68,(ValueTypes *)&local_138,(ValueTypes *)&local_158);
  local_118._8_8_ = 0;
  local_100 = std::
              _Function_handler<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc:353:21)>
              ::_M_invoke;
  local_108 = std::
              _Function_handler<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc:353:21)>
              ::_M_manager;
  local_118._M_unused._M_object = this;
  wabt::interp::HostFunc::New(&host_func,store,&local_68,(Callback *)&local_118);
  if (local_108 != (code *)0x0) {
    (*local_108)(&local_118,&local_118,__destroy_functor);
  }
  wabt::interp::FuncType::~FuncType(&local_68);
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base(&local_158);
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base(&local_138);
  trap.obj_ = (Trap *)((host_func.obj_)->super_Func).super_Extern.super_Object.self_.index;
  results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>>::
  _M_range_initialize<wabt::interp::Ref_const*>
            ((vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)&results,&trap);
  InterpTest::Instantiate(&this->super_InterpTest,(RefVec *)&results);
  std::_Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::~_Vector_base
            ((_Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_> *)&results);
  results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  trap.obj_ = (Trap *)0x0;
  trap.store_ = (Store *)0x0;
  trap.root_index_ = 0;
  InterpTest::GetFuncExport((Ptr *)&gtest_ar,&this->super_InterpTest,0);
  this_00 = (Func *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
  local_1e8.data_ = (AssertHelperData *)0x1;
  local_1e0 = 0;
  local_1d8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  uStack_1d0 = 0;
  local_1c8 = 0;
  std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>::
  _M_range_initialize<wabt::interp::Value_const*>
            ((vector<wabt::interp::Value,std::allocator<wabt::interp::Value>> *)&local_1d8,
             &local_1e8);
  result = wabt::interp::Func::Call(this_00,&thread,(Values *)&local_1d8,&results,&trap);
  std::_Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~_Vector_base
            ((_Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)&local_1d8);
  wabt::interp::RefPtr<wabt::interp::DefinedFunc>::reset((Ptr *)&gtest_ar);
  local_1d8._M_head_impl = local_1d8._M_head_impl & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
            ((internal *)&gtest_ar,"Result::Ok","result",(Enum *)&local_1d8,&result);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1d8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc"
               ,0x176,pcVar1);
    testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&local_1d8);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    if (local_1d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1d8._M_head_impl + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    local_1e8.data_._0_4_ = 1;
    local_1d8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((long)results.
                super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)results.
                super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                _M_impl.super__Vector_impl_data._M_start >> 4);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)&gtest_ar,"1u","results.size()",(uint *)&local_1e8,
               (unsigned_long *)&local_1d8);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_1d8);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc"
                 ,0x177,pcVar1);
      testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&local_1d8);
      testing::internal::AssertHelper::~AssertHelper(&local_1e8);
      if (local_1d8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_1d8._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    local_1d8._M_head_impl._0_4_ = 0xb;
    local_1e8.data_._0_4_ =
         ((results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
           _M_impl.super__Vector_impl_data._M_start)->field_0).i32_;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)&gtest_ar,"11u","results[0].Get<u32>()",(uint *)&local_1d8,
               (uint *)&local_1e8);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_1d8);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc"
                 ,0x178,pcVar1);
      testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&local_1d8);
      testing::internal::AssertHelper::~AssertHelper(&local_1e8);
      if (local_1d8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_1d8._M_head_impl + 8))();
      }
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  wabt::interp::RefPtr<wabt::interp::Trap>::reset(&trap);
  std::_Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~_Vector_base
            (&results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>)
  ;
  wabt::interp::RefPtr<wabt::interp::HostFunc>::reset(&host_func);
  wabt::interp::Thread::~Thread(&thread);
  return;
}

Assistant:

TEST_F(InterpTest, HostFunc_PingPong_SameThread) {
  // (import "" "f" (func $f (param i32) (result i32)))
  // (func (export "g") (param i32) (result i32)
  //   (call $f (i32.add (local.get 0) (i32.const 1))))
  ReadModule({
      0x00, 0x61, 0x73, 0x6d, 0x01, 0x00, 0x00, 0x00, 0x01, 0x06, 0x01, 0x60,
      0x01, 0x7f, 0x01, 0x7f, 0x02, 0x06, 0x01, 0x00, 0x01, 0x66, 0x00, 0x00,
      0x03, 0x02, 0x01, 0x00, 0x07, 0x05, 0x01, 0x01, 0x67, 0x00, 0x01, 0x0a,
      0x0b, 0x01, 0x09, 0x00, 0x20, 0x00, 0x41, 0x01, 0x6a, 0x10, 0x00, 0x0b,
  });

  Thread thread(store_);

  auto host_func =
      HostFunc::New(store_, FuncType{{ValueType::I32}, {ValueType::I32}},
                    [&](Thread& t, const Values& params, Values& results,
                        Trap::Ptr* out_trap) -> Result {
                      auto val = params[0].Get<u32>();
                      if (val < 10) {
                        return GetFuncExport(0)->Call(t, {Value::Make(val * 2)},
                                                      results, out_trap);
                      }
                      results[0] = Value::Make(val);
                      return Result::Ok;
                    });

  Instantiate({host_func->self()});

  // Should produce the following calls:
  //  g(1) -> f(2) -> g(4) -> f(5) -> g(10) -> f(11) -> return 11

  Values results;
  Trap::Ptr trap;
  Result result =
      GetFuncExport(0)->Call(thread, {Value::Make(1)}, results, &trap);

  ASSERT_EQ(Result::Ok, result);
  EXPECT_EQ(1u, results.size());
  EXPECT_EQ(11u, results[0].Get<u32>());
}